

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

Limit __thiscall
google::protobuf::io::CodedInputStream::ReadLengthAndPushLimit(CodedInputStream *this)

{
  byte *pbVar1;
  Limit LVar2;
  int64 iVar3;
  uint32 first_byte_or_zero;
  uint byte_limit;
  
  pbVar1 = this->buffer_;
  byte_limit = 0;
  first_byte_or_zero = 0;
  if ((pbVar1 < this->buffer_end_) && (first_byte_or_zero = (uint32)*pbVar1, -1 < (char)*pbVar1)) {
    this->buffer_ = pbVar1 + 1;
    byte_limit = first_byte_or_zero;
  }
  else {
    iVar3 = ReadVarint32Fallback(this,first_byte_or_zero);
    if (-1 < iVar3) {
      byte_limit = (uint)iVar3;
    }
  }
  LVar2 = PushLimit(this,byte_limit);
  return LVar2;
}

Assistant:

CodedInputStream::Limit CodedInputStream::ReadLengthAndPushLimit() {
  uint32 length;
  return PushLimit(ReadVarint32(&length) ? length : 0);
}